

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

future<void> DelayedSetChannel(int channel,int value,double delay)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Result_base *this;
  undefined4 in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_0000003c;
  _State_baseV2 *__tmp;
  future<void> fVar3;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  long *local_60;
  __state_type local_58;
  double local_48;
  _func_int **local_40 [2];
  
  local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = delay;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011db20;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var1[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var1[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0011db70;
  this = (_Result_base *)operator_new(0x10);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  std::__future_base::_Result_base::_Result_base(this);
  *(undefined ***)this = &PTR__M_destroy_0011dcb8;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)this;
  *(double *)&p_Var1[4]._M_use_count = local_48;
  *(int *)&p_Var1[5]._vptr__Sp_counted_base = value;
  *(undefined4 *)((long)&p_Var1[5]._vptr__Sp_counted_base + 4) = in_EDX;
  local_40[0] = (_func_int **)0x0;
  local_60 = (long *)operator_new(0x20);
  *local_60 = (long)&PTR___State_0011dbc8;
  local_60[1] = (long)(p_Var1 + 1);
  local_60[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:66:16)>_>,_void>
                      ::_M_run;
  local_60[3] = 0;
  std::thread::_M_start_thread(local_40,&local_60,0);
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  if (p_Var1[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var1[3]._vptr__Sp_counted_base = local_40[0];
    local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var1 + 1);
    local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    std::__basic_future<void>::__basic_future
              ((__basic_future<void> *)CONCAT44(in_register_0000003c,channel),&local_58);
    _Var2._M_pi = extraout_RDX;
    if (local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var2._M_pi = extraout_RDX_00;
    }
    fVar3.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    fVar3.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(in_register_0000003c,channel);
    return (future<void>)
           fVar3.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::terminate();
}

Assistant:

std::future<void> DelayedSetChannel(int channel, int value, double delay)
{
    auto run = [=]()
    {
        sleep(delay);
        GPIO::output(channel, value);
    };

    return std::async(std::launch::async, run);
}